

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Vec_Ptr_t * Aig_ManMiterPartitioned(Aig_Man_t *p1,Aig_Man_t *p2,int nPartSize,int fSmart)

{
  int iVar1;
  Vec_Int_t *vPart_00;
  Vec_Int_t *p;
  int local_70;
  int local_6c;
  int k;
  int i;
  Vec_Int_t *vPartSupp;
  Vec_Int_t *vPart;
  Vec_Ptr_t *vPartSupps;
  Vec_Ptr_t *vParts;
  Vec_Ptr_t *vNodes2;
  Vec_Ptr_t *vNodes1;
  Vec_Ptr_t *vMiters;
  Aig_Obj_t *pMiter;
  Aig_Man_t *pNew;
  int fSmart_local;
  int nPartSize_local;
  Aig_Man_t *p2_local;
  Aig_Man_t *p1_local;
  
  pNew._0_4_ = fSmart;
  pNew._4_4_ = nPartSize;
  _fSmart_local = p2;
  p2_local = p1;
  if (fSmart == 0) {
    vPartSupps = Aig_ManPartitionNaive(p1,nPartSize);
    vPart = (Vec_Int_t *)Aig_ManSupportNodes(p2_local,vPartSupps);
  }
  else {
    vPartSupps = Aig_ManPartitionSmart(p1,nPartSize,0,(Vec_Ptr_t **)&vPart);
  }
  iVar1 = Vec_PtrSize(vPartSupps);
  vNodes1 = Vec_PtrAlloc(iVar1);
  local_6c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vPartSupps);
    if (iVar1 <= local_6c) break;
    vPart_00 = (Vec_Int_t *)Vec_PtrEntry(vPartSupps,local_6c);
    p = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vPart,local_6c);
    pMiter = (Aig_Obj_t *)Aig_ManStart(1000);
    local_70 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p);
      if (iVar1 <= local_70) break;
      Aig_ObjCreateCi((Aig_Man_t *)pMiter);
      local_70 = local_70 + 1;
    }
    vNodes2 = Aig_ManDupPart((Aig_Man_t *)pMiter,p2_local,vPart_00,p,0);
    vParts = Aig_ManDupPart((Aig_Man_t *)pMiter,_fSmart_local,vPart_00,p,0);
    vMiters = (Vec_Ptr_t *)Aig_MiterTwo((Aig_Man_t *)pMiter,vNodes2,vParts);
    Vec_PtrFree(vNodes2);
    Vec_PtrFree(vParts);
    Aig_ObjCreateCo((Aig_Man_t *)pMiter,(Aig_Obj_t *)vMiters);
    Aig_ManCleanup((Aig_Man_t *)pMiter);
    Vec_PtrPush(vNodes1,pMiter);
    local_6c = local_6c + 1;
  }
  Vec_VecFree((Vec_Vec_t *)vPartSupps);
  Vec_VecFree((Vec_Vec_t *)vPart);
  return vNodes1;
}

Assistant:

Vec_Ptr_t * Aig_ManMiterPartitioned( Aig_Man_t * p1, Aig_Man_t * p2, int nPartSize, int fSmart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pMiter;
    Vec_Ptr_t * vMiters, * vNodes1, * vNodes2;
    Vec_Ptr_t * vParts, * vPartSupps;
    Vec_Int_t * vPart, * vPartSupp;
    int i, k;
    // partition the first manager
    if ( fSmart )
        vParts = Aig_ManPartitionSmart( p1, nPartSize, 0, &vPartSupps );
    else
    {
        vParts = Aig_ManPartitionNaive( p1, nPartSize );
        vPartSupps = Aig_ManSupportNodes( p1, vParts );
    }
    // derive miters
    vMiters = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    for ( i = 0; i < Vec_PtrSize(vParts); i++ )
    {
        // get partition and its support
        vPart     = (Vec_Int_t *)Vec_PtrEntry( vParts, i );
        vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSupps, i );
        // create the new miter
        pNew = Aig_ManStart( 1000 );
        // create the PIs
        for ( k = 0; k < Vec_IntSize(vPartSupp); k++ )
            Aig_ObjCreateCi( pNew );
        // copy the components
        vNodes1 = Aig_ManDupPart( pNew, p1, vPart, vPartSupp, 0 );
        vNodes2 = Aig_ManDupPart( pNew, p2, vPart, vPartSupp, 0 );
        // create the miter
        pMiter = Aig_MiterTwo( pNew, vNodes1, vNodes2 );
        Vec_PtrFree( vNodes1 );
        Vec_PtrFree( vNodes2 );
        // create the output
        Aig_ObjCreateCo( pNew, pMiter );
        // clean up
        Aig_ManCleanup( pNew );
        Vec_PtrPush( vMiters, pNew );
    }
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_VecFree( (Vec_Vec_t *)vPartSupps );
    return vMiters;
}